

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_UpdateEngine(FAudio *audio,float *output)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x98) == 0) {
    FAudio_INTERNAL_GenerateOutput(audio,output);
  }
  else {
    (**(code **)(in_RDI + 0x98))
              (FAudio_INTERNAL_GenerateOutput,in_RDI,in_RSI,*(undefined8 *)(in_RDI + 0x90));
  }
  return;
}

Assistant:

void FAudio_INTERNAL_UpdateEngine(FAudio *audio, float *output)
{
	LOG_FUNC_ENTER(audio)
	if (audio->pClientEngineProc)
	{
		audio->pClientEngineProc(
			&FAudio_INTERNAL_GenerateOutput,
			audio,
			output,
			audio->clientEngineUser
		);
	}
	else
	{
		FAudio_INTERNAL_GenerateOutput(audio, output);
	}